

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-bind-error.c
# Opt level: O0

int run_test_pipe_listen_without_bind(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  undefined1 local_f8 [4];
  int r;
  uv_pipe_t server;
  
  puVar2 = uv_default_loop();
  iVar1 = uv_pipe_init(puVar2,(uv_pipe_t *)local_f8,0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-bind-error.c"
            ,0x80,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_listen((uv_stream_t *)local_f8,0x1000,(uv_connection_cb)0x0);
  if ((long)iVar1 != -0x16) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-bind-error.c"
            ,0x83,"r","==","UV_EINVAL",(long)iVar1,"==",0xffffffffffffffea);
    abort();
  }
  uv_close((uv_handle_t *)local_f8,close_cb);
  puVar2 = uv_default_loop();
  uv_run(puVar2,UV_RUN_DEFAULT);
  if ((long)close_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-bind-error.c"
            ,0x89,"1","==","close_cb_called",1,"==",(long)close_cb_called);
    abort();
  }
  puVar2 = uv_default_loop();
  close_loop(puVar2);
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_close(puVar2);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-bind-error.c"
            ,0x8b,"0","==","uv_loop_close(uv_default_loop())",0,"==",(long)iVar1);
    abort();
  }
  uv_library_shutdown();
  return 0;
}

Assistant:

TEST_IMPL(pipe_listen_without_bind) {
#if defined(NO_SELF_CONNECT)
  RETURN_SKIP(NO_SELF_CONNECT);
#endif
  uv_pipe_t server;
  int r;

  r = uv_pipe_init(uv_default_loop(), &server, 0);
  ASSERT_OK(r);

  r = uv_listen((uv_stream_t*)&server, SOMAXCONN, NULL);
  ASSERT_EQ(r, UV_EINVAL);

  uv_close((uv_handle_t*)&server, close_cb);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT_EQ(1, close_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}